

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_double_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_fe *rzr)

{
  uint32_t *puVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  secp256k1_fe t2;
  secp256k1_fe t3;
  secp256k1_fe t1;
  secp256k1_fe t4;
  secp256k1_fe local_d0;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  iVar2 = a->infinity;
  r->infinity = iVar2;
  if (iVar2 != 0) {
    return;
  }
  secp256k1_fe_mul(&r->z,&a->z,&a->y);
  (r->z).n[0] = (r->z).n[0] << 1;
  puVar1 = (r->z).n + 1;
  *puVar1 = *puVar1 << 1;
  puVar1 = (r->z).n + 2;
  *puVar1 = *puVar1 << 1;
  puVar1 = (r->z).n + 3;
  *puVar1 = *puVar1 << 1;
  puVar1 = (r->z).n + 4;
  *puVar1 = *puVar1 << 1;
  puVar1 = (r->z).n + 5;
  *puVar1 = *puVar1 << 1;
  puVar1 = (r->z).n + 6;
  *puVar1 = *puVar1 << 1;
  puVar1 = (r->z).n + 7;
  *puVar1 = *puVar1 << 1;
  puVar1 = (r->z).n + 8;
  *puVar1 = *puVar1 << 1;
  puVar1 = (r->z).n + 9;
  *puVar1 = *puVar1 << 1;
  secp256k1_fe_sqr(&local_80,&a->x);
  local_80.n[0] = local_80.n[0] * 3;
  local_80.n[1] = local_80.n[1] * 3;
  local_80.n[2] = local_80.n[2] * 3;
  local_80.n[3] = local_80.n[3] * 3;
  local_80.n[4] = local_80.n[4] * 3;
  local_80.n[5] = local_80.n[5] * 3;
  local_80.n[6] = local_80.n[6] * 3;
  local_80.n[7] = local_80.n[7] * 3;
  local_80.n[8] = local_80.n[8] * 3;
  local_80.n[9] = local_80.n[9] * 3;
  secp256k1_fe_sqr(&local_d0,&local_80);
  secp256k1_fe_sqr(&local_a8,&a->y);
  local_a8.n[0] = local_a8.n[0] << 1;
  local_a8.n[1] = local_a8.n[1] << 1;
  local_a8.n[2] = local_a8.n[2] << 1;
  local_a8.n[3] = local_a8.n[3] << 1;
  local_a8.n[4] = local_a8.n[4] << 1;
  local_a8.n[5] = local_a8.n[5] << 1;
  local_a8.n[6] = local_a8.n[6] << 1;
  local_a8.n[7] = local_a8.n[7] << 1;
  local_a8.n[8] = local_a8.n[8] << 1;
  local_a8.n[9] = local_a8.n[9] << 1;
  secp256k1_fe_sqr(&local_58,&local_a8);
  uVar16 = local_58.n[9];
  uVar15 = local_58.n[8];
  uVar14 = local_58.n[7];
  uVar13 = local_58.n[6];
  uVar12 = local_58.n[5];
  uVar11 = local_58.n[4];
  uVar10 = local_58.n[3];
  uVar9 = local_58.n[2];
  uVar8 = local_58.n[1];
  uVar7 = local_58.n[0];
  local_58.n[0] = local_58.n[0] * 2;
  local_58.n[1] = local_58.n[1] * 2;
  local_58.n[2] = local_58.n[2] * 2;
  local_58.n[3] = local_58.n[3] * 2;
  local_58.n[4] = local_58.n[4] * 2;
  local_58.n[5] = local_58.n[5] * 2;
  local_58.n[6] = local_58.n[6] * 2;
  local_58.n[7] = local_58.n[7] * 2;
  local_58.n[8] = local_58.n[8] * 2;
  local_58.n[9] = local_58.n[9] * 2;
  secp256k1_fe_mul(&local_a8,&local_a8,&a->x);
  *(ulong *)(r->x).n = CONCAT44(local_a8.n[1],local_a8.n[0]);
  *(ulong *)((r->x).n + 2) = CONCAT44(local_a8.n[3],local_a8.n[2]);
  *(ulong *)((r->x).n + 4) = CONCAT44(local_a8.n[5],local_a8.n[4]);
  *(ulong *)((r->x).n + 6) = CONCAT44(local_a8.n[7],local_a8.n[6]);
  *(ulong *)((r->x).n + 8) = CONCAT44(local_a8.n[9],local_a8.n[8]);
  uVar17 = (r->x).n[0];
  uVar18 = (r->x).n[1];
  (r->x).n[0] = uVar17 * 4;
  (r->x).n[1] = uVar18 * 4;
  uVar19 = (r->x).n[2];
  (r->x).n[2] = uVar19 * 4;
  uVar21 = (r->x).n[3];
  (r->x).n[3] = uVar21 * 4;
  uVar22 = (r->x).n[4];
  uVar23 = (r->x).n[5];
  (r->x).n[4] = uVar22 * 4;
  (r->x).n[5] = uVar23 * 4;
  uVar3 = (r->x).n[6];
  (r->x).n[6] = uVar3 * 4;
  uVar4 = (r->x).n[7];
  (r->x).n[7] = uVar4 * 4;
  uVar5 = (r->x).n[8];
  (r->x).n[8] = uVar5 * 4;
  uVar6 = (r->x).n[9];
  uVar20 = uVar17 * -4 + 0x27ffd9d6;
  (r->x).n[0] = uVar20;
  uVar25 = uVar18 * -4 + 0x27fffd76;
  (r->x).n[1] = uVar25;
  uVar17 = uVar19 * -4 + 0x27fffff6;
  (r->x).n[2] = uVar17;
  uVar21 = uVar21 * -4 + 0x27fffff6;
  (r->x).n[3] = uVar21;
  uVar24 = uVar22 * -4 + 0x27fffff6;
  (r->x).n[4] = uVar24;
  uVar19 = uVar23 * -4 + 0x27fffff6;
  (r->x).n[5] = uVar19;
  uVar23 = uVar3 * -4 + 0x27fffff6;
  (r->x).n[6] = uVar23;
  uVar22 = uVar4 * -4 + 0x27fffff6;
  (r->x).n[7] = uVar22;
  uVar18 = uVar5 * -4 + 0x27fffff6;
  (r->x).n[8] = uVar18;
  (r->x).n[9] = uVar6 * -4 + 0x27ffff6;
  (r->x).n[0] = uVar20 + local_d0.n[0];
  (r->x).n[1] = uVar25 + local_d0.n[1];
  (r->x).n[2] = uVar17 + local_d0.n[2];
  (r->x).n[3] = uVar21 + local_d0.n[3];
  (r->x).n[4] = uVar24 + local_d0.n[4];
  (r->x).n[5] = uVar19 + local_d0.n[5];
  (r->x).n[6] = uVar23 + local_d0.n[6];
  (r->x).n[7] = uVar22 + local_d0.n[7];
  (r->x).n[8] = uVar18 + local_d0.n[8];
  (r->x).n[9] = local_d0.n[9] + uVar6 * -4 + 0x27ffff6;
  local_d0.n[0] = 0xffff0bc - local_d0.n[0];
  local_d0.n[1] = 0xffffefc - local_d0.n[1];
  local_d0.n[2] = 0xffffffc - local_d0.n[2];
  local_d0.n[3] = 0xffffffc - local_d0.n[3];
  local_d0.n[4] = 0xffffffc - local_d0.n[4];
  local_d0.n[5] = 0xffffffc - local_d0.n[5];
  local_d0.n[6] = 0xffffffc - local_d0.n[6];
  local_d0.n[7] = 0xffffffc - local_d0.n[7];
  local_d0.n[8] = 0xffffffc - local_d0.n[8];
  local_d0.n[9] = 0xfffffc - local_d0.n[9];
  local_a8.n[0] = local_d0.n[0] + local_a8.n[0] * 6;
  local_a8.n[1] = local_d0.n[1] + local_a8.n[1] * 6;
  local_a8.n[2] = local_d0.n[2] + local_a8.n[2] * 6;
  local_a8.n[3] = local_d0.n[3] + local_a8.n[3] * 6;
  local_a8.n[4] = local_d0.n[4] + local_a8.n[4] * 6;
  local_a8.n[5] = local_d0.n[5] + local_a8.n[5] * 6;
  local_a8.n[6] = local_d0.n[6] + local_a8.n[6] * 6;
  local_a8.n[7] = local_d0.n[7] + local_a8.n[7] * 6;
  local_a8.n[8] = local_d0.n[8] + local_a8.n[8] * 6;
  local_a8.n[9] = local_d0.n[9] + local_a8.n[9] * 6;
  secp256k1_fe_mul(&r->y,&local_80,&local_a8);
  (r->y).n[0] = (r->y).n[0] + uVar7 * -2 + 0x17ffe91a;
  puVar1 = (r->y).n + 1;
  *puVar1 = *puVar1 + uVar8 * -2 + 0x17fffe7a;
  puVar1 = (r->y).n + 2;
  *puVar1 = *puVar1 + uVar9 * -2 + 0x17fffffa;
  puVar1 = (r->y).n + 3;
  *puVar1 = *puVar1 + uVar10 * -2 + 0x17fffffa;
  puVar1 = (r->y).n + 4;
  *puVar1 = *puVar1 + uVar11 * -2 + 0x17fffffa;
  puVar1 = (r->y).n + 5;
  *puVar1 = *puVar1 + uVar12 * -2 + 0x17fffffa;
  puVar1 = (r->y).n + 6;
  *puVar1 = *puVar1 + uVar13 * -2 + 0x17fffffa;
  puVar1 = (r->y).n + 7;
  *puVar1 = *puVar1 + uVar14 * -2 + 0x17fffffa;
  puVar1 = (r->y).n + 8;
  *puVar1 = *puVar1 + uVar15 * -2 + 0x17fffffa;
  puVar1 = (r->y).n + 9;
  *puVar1 = *puVar1 + uVar16 * -2 + 0x17ffffa;
  return;
}

Assistant:

static void secp256k1_gej_double_var(secp256k1_gej *r, const secp256k1_gej *a, secp256k1_fe *rzr) {
    /* Operations: 3 mul, 4 sqr, 0 normalize, 12 mul_int/add/negate.
     *
     * Note that there is an implementation described at
     *     https://hyperelliptic.org/EFD/g1p/auto-shortw-jacobian-0.html#doubling-dbl-2009-l
     * which trades a multiply for a square, but in practice this is actually slower,
     * mainly because it requires more normalizations.
     */
    secp256k1_fe t1,t2,t3,t4;
    /** For secp256k1, 2Q is infinity if and only if Q is infinity. This is because if 2Q = infinity,
     *  Q must equal -Q, or that Q.y == -(Q.y), or Q.y is 0. For a point on y^2 = x^3 + 7 to have
     *  y=0, x^3 must be -7 mod p. However, -7 has no cube root mod p.
     *
     *  Having said this, if this function receives a point on a sextic twist, e.g. by
     *  a fault attack, it is possible for y to be 0. This happens for y^2 = x^3 + 6,
     *  since -6 does have a cube root mod p. For this point, this function will not set
     *  the infinity flag even though the point doubles to infinity, and the result
     *  point will be gibberish (z = 0 but infinity = 0).
     */
    r->infinity = a->infinity;
    if (r->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        return;
    }

    if (rzr != NULL) {
        *rzr = a->y;
        secp256k1_fe_normalize_weak(rzr);
        secp256k1_fe_mul_int(rzr, 2);
    }

    secp256k1_fe_mul(&r->z, &a->z, &a->y);
    secp256k1_fe_mul_int(&r->z, 2);       /* Z' = 2*Y*Z (2) */
    secp256k1_fe_sqr(&t1, &a->x);
    secp256k1_fe_mul_int(&t1, 3);         /* T1 = 3*X^2 (3) */
    secp256k1_fe_sqr(&t2, &t1);           /* T2 = 9*X^4 (1) */
    secp256k1_fe_sqr(&t3, &a->y);
    secp256k1_fe_mul_int(&t3, 2);         /* T3 = 2*Y^2 (2) */
    secp256k1_fe_sqr(&t4, &t3);
    secp256k1_fe_mul_int(&t4, 2);         /* T4 = 8*Y^4 (2) */
    secp256k1_fe_mul(&t3, &t3, &a->x);    /* T3 = 2*X*Y^2 (1) */
    r->x = t3;
    secp256k1_fe_mul_int(&r->x, 4);       /* X' = 8*X*Y^2 (4) */
    secp256k1_fe_negate(&r->x, &r->x, 4); /* X' = -8*X*Y^2 (5) */
    secp256k1_fe_add(&r->x, &t2);         /* X' = 9*X^4 - 8*X*Y^2 (6) */
    secp256k1_fe_negate(&t2, &t2, 1);     /* T2 = -9*X^4 (2) */
    secp256k1_fe_mul_int(&t3, 6);         /* T3 = 12*X*Y^2 (6) */
    secp256k1_fe_add(&t3, &t2);           /* T3 = 12*X*Y^2 - 9*X^4 (8) */
    secp256k1_fe_mul(&r->y, &t1, &t3);    /* Y' = 36*X^3*Y^2 - 27*X^6 (1) */
    secp256k1_fe_negate(&t2, &t4, 2);     /* T2 = -8*Y^4 (3) */
    secp256k1_fe_add(&r->y, &t2);         /* Y' = 36*X^3*Y^2 - 27*X^6 - 8*Y^4 (4) */
}